

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

bool ImNodes::Connection(void *input_node,char *input_slot,void *output_node,char *output_slot)

{
  ImGuiStorage *this;
  Pair *pPVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ImU32 IVar6;
  int iVar7;
  Pair **this_00;
  char *__s2;
  float fVar8;
  float fVar9;
  int local_88;
  int pending_slot_kind;
  char *pending_slot_title;
  char *local_68;
  void *pending_node_id;
  _IgnoreSlot local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pfVar2 = gCanvas;
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,600,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_node == (void *)0x0) {
    __assert_fail("input_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x259,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_slot == (char *)0x0) {
    __assert_fail("input_slot != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x25a,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (output_node != (void *)0x0) {
    if (output_slot == (char *)0x0) {
      __assert_fail("output_slot != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                    ,0x25c,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
    }
    this = *(ImGuiStorage **)(gCanvas + 0x26);
    pPVar1 = this[3].Data.Data;
    bVar5 = true;
    if (pPVar1 != (Pair *)output_node && pPVar1 != (Pair *)input_node) {
      IVar6 = MakeSlotDataID("x",input_slot,input_node,true);
      fVar8 = ImGuiStorage::GetFloat(this,IVar6,0.0);
      IVar6 = MakeSlotDataID("y",input_slot,input_node,true);
      local_38.y = ImGuiStorage::GetFloat(this,IVar6,0.0);
      IVar6 = MakeSlotDataID("x",output_slot,output_node,false);
      fVar9 = ImGuiStorage::GetFloat(this,IVar6,0.0);
      local_68 = output_slot;
      IVar6 = MakeSlotDataID("y",output_slot,output_node,false);
      local_40.y = ImGuiStorage::GetFloat(this,IVar6,0.0);
      local_38.x = fVar8 + pfVar2[0x24] * *pfVar2;
      local_40.x = fVar9 - pfVar2[0x24] * *pfVar2;
      bVar3 = RenderConnection(&local_38,&local_40,pfVar2[0x23]);
      bVar5 = true;
      if ((bVar3) && (bVar4 = ImGui::IsWindowHovered(0), bVar4)) {
        bVar5 = ImGui::IsMouseDoubleClicked(0);
        bVar5 = !bVar5;
      }
      local_88 = 1;
      IVar6 = MakeSlotDataID("hovered",input_slot,input_node,true);
      ImGuiStorage::SetFloat(this,IVar6,(float)(byte)(bVar3 & bVar5));
      __s2 = local_68;
      IVar6 = MakeSlotDataID("hovered",local_68,output_node,false);
      ImGuiStorage::SetFloat(this,IVar6,(float)(byte)(bVar3 & bVar5));
      bVar3 = GetPendingConnection(&pending_node_id,&pending_slot_title,&pending_slot_kind);
      if (bVar3) {
        local_58.slot_kind = 0;
        local_58._20_4_ = 0;
        local_58.node_id = (void *)0x0;
        local_58.slot_name = (char *)0x0;
        if (pending_slot_kind < 0) {
          if (pending_node_id != input_node) {
            return bVar5;
          }
          iVar7 = strcmp(pending_slot_title,input_slot);
          input_node = output_node;
          if (iVar7 != 0) {
            return bVar5;
          }
        }
        else {
          if (pending_node_id != output_node) {
            return bVar5;
          }
          iVar7 = strcmp(pending_slot_title,__s2);
          if (iVar7 != 0) {
            return bVar5;
          }
          local_88 = -1;
          __s2 = input_slot;
        }
        local_58.slot_kind = local_88;
        this_00 = &this[9].Data.Data;
        local_58.node_id = input_node;
        local_58.slot_name = __s2;
        bVar3 = ImVector<ImNodes::_IgnoreSlot>::contains
                          ((ImVector<ImNodes::_IgnoreSlot> *)this_00,&local_58);
        if (!bVar3) {
          ImVector<ImNodes::_IgnoreSlot>::push_back
                    ((ImVector<ImNodes::_IgnoreSlot> *)this_00,&local_58);
        }
      }
    }
    return bVar5;
  }
  __assert_fail("output_node != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x25b,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
}

Assistant:

bool Connection(void* input_node, const char* input_slot, void* output_node, const char* output_slot)
{
    assert(gCanvas != nullptr);
    assert(input_node != nullptr);
    assert(input_slot != nullptr);
    assert(output_node != nullptr);
    assert(output_slot != nullptr);

    bool is_connected = true;
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (input_node == impl->auto_position_node_id || output_node == impl->auto_position_node_id)
        // Do not render connection to newly added output node because node is rendered outside of screen on the first frame and will be repositioned.
        return is_connected;

    ImVec2 input_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", input_slot, input_node, true)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", input_slot, input_node, true)),
    };

    ImVec2 output_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", output_slot, output_node, false)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", output_slot, output_node, false)),
    };

    // Indent connection a bit into slot widget.
    float connection_indent = canvas->style.connection_indent * canvas->zoom;
    input_slot_pos.x += connection_indent;
    output_slot_pos.x -= connection_indent;

    bool curve_hovered = RenderConnection(input_slot_pos, output_slot_pos, canvas->style.curve_thickness);
    if (curve_hovered && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDoubleClicked(0))
            is_connected = false;
    }

    impl->cached_data.SetFloat(MakeSlotDataID("hovered", input_slot, input_node, true), curve_hovered && is_connected);
    impl->cached_data.SetFloat(MakeSlotDataID("hovered", output_slot, output_node, false), curve_hovered && is_connected);

    void* pending_node_id;
    const char* pending_slot_title;
    int pending_slot_kind;
    if (GetPendingConnection(&pending_node_id, &pending_slot_title, &pending_slot_kind))
    {
        _IgnoreSlot ignore_connection{};
        if (IsInputSlotKind(pending_slot_kind))
        {
            if (pending_node_id == input_node && strcmp(pending_slot_title, input_slot) == 0)
            {
                ignore_connection.node_id = output_node;
                ignore_connection.slot_name = output_slot;
                ignore_connection.slot_kind = OutputSlotKind(1);
            }
        }
        else
        {
            if (pending_node_id == output_node && strcmp(pending_slot_title, output_slot) == 0)
            {
                ignore_connection.node_id = input_node;
                ignore_connection.slot_name = input_slot;
                ignore_connection.slot_kind = InputSlotKind(1);
            }
        }
        if (ignore_connection.node_id)
        {
            if (!impl->ignore_connections.contains(ignore_connection))
                impl->ignore_connections.push_back(ignore_connection);
        }
    }

    return is_connected;
}